

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O1

StatT * __thiscall MyGame::Example::Stat::UnPack(Stat *this,resolver_function_t *_resolver)

{
  ushort uVar1;
  uint16_t uVar2;
  StatT *this_00;
  Stat *pSVar3;
  long lVar4;
  unsigned_short vtsize;
  ushort uVar5;
  int64_t iVar6;
  pointer *__ptr;
  unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_> _o;
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = (StatT *)operator_new(0x30);
  (this_00->id)._M_dataplus._M_p = (pointer)0x0;
  (this_00->id)._M_string_length = 0;
  (this_00->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->id).field_2 + 8) = 0;
  this_00->val = 0;
  *(undefined8 *)&this_00->count = 0;
  (this_00->id)._M_dataplus._M_p = (pointer)&(this_00->id).field_2;
  uVar1 = 0;
  (this_00->id)._M_string_length = 0;
  (this_00->id).field_2._M_local_buf[0] = '\0';
  this_00->val = 0;
  this_00->count = 0;
  if (4 < *(ushort *)(this + -(long)*(int *)this)) {
    uVar1 = *(ushort *)(this + (4 - (long)*(int *)this));
  }
  if (uVar1 == 0) {
    pSVar3 = (Stat *)0x0;
  }
  else {
    pSVar3 = this + (ulong)*(uint *)(this + uVar1) + (ulong)uVar1;
  }
  if (pSVar3 != (Stat *)0x0) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,pSVar3 + 4,pSVar3 + (ulong)*(uint *)pSVar3 + 4);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  lVar4 = -(long)*(int *)this;
  uVar1 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar1 < 7) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(this + lVar4 + 6);
  }
  if (uVar5 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int64_t *)(this + uVar5);
  }
  this_00->val = iVar6;
  if (uVar1 < 9) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(this + lVar4 + 8);
  }
  if (uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(uint16_t *)(this + uVar1);
  }
  this_00->count = uVar2;
  return this_00;
}

Assistant:

inline StatT *Stat::UnPack(const ::flatbuffers::resolver_function_t *_resolver) const {
  auto _o = std::unique_ptr<StatT>(new StatT());
  UnPackTo(_o.get(), _resolver);
  return _o.release();
}